

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  LHS_assign *pLVar4;
  FuncState *pFVar5;
  expdesc e;
  
  if (3 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  iVar3 = testnext(ls,0x2c);
  if (iVar3 == 0) {
    checknext(ls,0x3d);
    iVar3 = explist1(ls,&e);
    if (nvars == iVar3) {
      luaK_setoneret(ls->fs,&e);
      pFVar5 = ls->fs;
      goto LAB_0010e121;
    }
    adjust_assign(ls,nvars,iVar3,&e);
    if (nvars < iVar3) {
      piVar1 = &ls->fs->freereg;
      *piVar1 = *piVar1 + (nvars - iVar3);
    }
  }
  else {
    e._0_8_ = lh;
    primaryexp(ls,(expdesc *)&e.u.s);
    if (e.u.s.info == 6) {
      pFVar5 = ls->fs;
      iVar3 = pFVar5->freereg;
      bVar2 = false;
      for (pLVar4 = lh; pLVar4 != (LHS_assign *)0x0; pLVar4 = pLVar4->prev) {
        if ((pLVar4->v).k == VINDEXED) {
          if ((pLVar4->v).u.s.info == e.t) {
            (pLVar4->v).u.s.info = iVar3;
            bVar2 = true;
          }
          if ((pLVar4->v).u.s.aux == e.t) {
            (pLVar4->v).u.s.aux = iVar3;
            bVar2 = true;
          }
        }
      }
      if (bVar2) {
        luaK_codeABC(pFVar5,OP_MOVE,pFVar5->freereg,e.t,0);
        luaK_reserveregs(pFVar5,1);
      }
    }
    iVar3 = 200 - (uint)ls->L->nCcalls;
    if (iVar3 < nvars) {
      errorlimit(ls->fs,iVar3,"variables in assignment");
    }
    assignment(ls,(LHS_assign *)&e,nvars + 1);
  }
  pFVar5 = ls->fs;
  e.t = -1;
  e.f = -1;
  e.u.s.info = pFVar5->freereg + -1;
  e.k = VNONRELOC;
LAB_0010e121:
  luaK_storevar(pFVar5,&lh->v,&e);
  return;
}

Assistant:

static void assignment(LexState*ls,struct LHS_assign*lh,int nvars){
expdesc e;
check_condition(ls,VLOCAL<=lh->v.k&&lh->v.k<=VINDEXED,
"syntax error");
if(testnext(ls,',')){
struct LHS_assign nv;
nv.prev=lh;
primaryexp(ls,&nv.v);
if(nv.v.k==VLOCAL)
check_conflict(ls,lh,&nv.v);
luaY_checklimit(ls->fs,nvars,200-ls->L->nCcalls,
"variables in assignment");
assignment(ls,&nv,nvars+1);
}
else{
int nexps;
checknext(ls,'=');
nexps=explist1(ls,&e);
if(nexps!=nvars){
adjust_assign(ls,nvars,nexps,&e);
if(nexps>nvars)
ls->fs->freereg-=nexps-nvars;
}
else{
luaK_setoneret(ls->fs,&e);
luaK_storevar(ls->fs,&lh->v,&e);
return;
}
}
init_exp(&e,VNONRELOC,ls->fs->freereg-1);
luaK_storevar(ls->fs,&lh->v,&e);
}